

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

bool __thiscall
glcts::ShaderBitfieldOperationCaseBinaryInt::test
          (ShaderBitfieldOperationCaseBinaryInt *this,Data *data)

{
  GLint GVar1;
  GLint local_28;
  GLint expected;
  GLint expected2;
  int i;
  Data *data_local;
  ShaderBitfieldOperationCaseBinaryInt *this_local;
  
  expected = 0;
  _expected2 = data;
  data_local = (Data *)this;
  while( true ) {
    if (this->m_components <= expected) {
      return true;
    }
    local_28 = 0;
    GVar1 = (*this->m_func)(_expected2->inIvec4[expected],_expected2->in2Ivec4[expected],&local_28);
    if ((_expected2->outIvec4[expected] != GVar1) || (_expected2->out2Ivec4[expected] != local_28))
    break;
    expected = expected + 1;
  }
  return false;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLint expected2 = 0;
			GLint expected  = m_func(data->inIvec4[i], data->in2Ivec4[i], expected2);
			if (data->outIvec4[i] != expected || data->out2Ivec4[i] != expected2)
			{
				return false;
			}
		}
		return true;
	}